

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O1

RAMReport * __thiscall npas4::RAMReport::operator-(RAMReport *this,RAMReport *x)

{
  RAMReport *in_RDI;
  
  in_RDI->RamVirtualAvailable = 0;
  in_RDI->RamVirtualUsed = 0;
  in_RDI->RamPhysicalUsedByCurrentProcessPeak = 0;
  in_RDI->RamVirtualTotal = 0;
  in_RDI->RamPhysicalUsed = 0;
  in_RDI->RamPhysicalUsedByCurrentProcess = 0;
  in_RDI->RamPhysicalTotal = 0;
  in_RDI->RamPhysicalAvailable = 0;
  in_RDI->RamSystemUsed = 0;
  in_RDI->RamSystemUsedByCurrentProcess = 0;
  in_RDI->RamSystemTotal = 0;
  in_RDI->RamSystemAvailable = 0;
  in_RDI->RamVirtualUsedByCurrentProcess = 0;
  in_RDI->RamSystemTotal = this->RamSystemTotal - x->RamSystemTotal;
  in_RDI->RamSystemAvailable = this->RamSystemAvailable - x->RamSystemAvailable;
  in_RDI->RamSystemUsed = this->RamSystemUsed - x->RamSystemUsed;
  in_RDI->RamSystemUsedByCurrentProcess =
       this->RamSystemUsedByCurrentProcess - x->RamSystemUsedByCurrentProcess;
  in_RDI->RamPhysicalTotal = this->RamPhysicalTotal - x->RamPhysicalTotal;
  in_RDI->RamPhysicalAvailable = this->RamPhysicalAvailable - x->RamPhysicalAvailable;
  in_RDI->RamPhysicalUsed = this->RamPhysicalUsed - x->RamPhysicalUsed;
  in_RDI->RamPhysicalUsedByCurrentProcess =
       this->RamPhysicalUsedByCurrentProcess - x->RamPhysicalUsedByCurrentProcess;
  in_RDI->RamPhysicalUsedByCurrentProcessPeak =
       this->RamPhysicalUsedByCurrentProcessPeak - x->RamPhysicalUsedByCurrentProcessPeak;
  in_RDI->RamVirtualTotal = this->RamVirtualTotal - x->RamVirtualTotal;
  in_RDI->RamVirtualAvailable = this->RamVirtualAvailable - x->RamVirtualAvailable;
  in_RDI->RamVirtualUsed = this->RamVirtualUsed - x->RamVirtualUsed;
  in_RDI->RamVirtualUsedByCurrentProcess =
       this->RamVirtualUsedByCurrentProcess - x->RamVirtualUsedByCurrentProcess;
  return in_RDI;
}

Assistant:

npas4::RAMReport npas4::RAMReport::operator-(const RAMReport& x)
{
	npas4::RAMReport r;
	r.RamSystemTotal = this->RamSystemTotal - x.RamSystemTotal;
	r.RamSystemAvailable = this->RamSystemAvailable - x.RamSystemAvailable;
	r.RamSystemUsed = this->RamSystemUsed - x.RamSystemUsed;
	r.RamSystemUsedByCurrentProcess = this->RamSystemUsedByCurrentProcess - x.RamSystemUsedByCurrentProcess;
	r.RamPhysicalTotal = this->RamPhysicalTotal - x.RamPhysicalTotal;
	r.RamPhysicalAvailable = this->RamPhysicalAvailable - x.RamPhysicalAvailable;
	r.RamPhysicalUsed = this->RamPhysicalUsed - x.RamPhysicalUsed;
	r.RamPhysicalUsedByCurrentProcess = this->RamPhysicalUsedByCurrentProcess - x.RamPhysicalUsedByCurrentProcess;
	r.RamPhysicalUsedByCurrentProcessPeak = this->RamPhysicalUsedByCurrentProcessPeak - x.RamPhysicalUsedByCurrentProcessPeak;
	r.RamVirtualTotal = this->RamVirtualTotal - x.RamVirtualTotal;
	r.RamVirtualAvailable = this->RamVirtualAvailable - x.RamVirtualAvailable;
	r.RamVirtualUsed = this->RamVirtualUsed - x.RamVirtualUsed;
	r.RamVirtualUsedByCurrentProcess = this->RamVirtualUsedByCurrentProcess - x.RamVirtualUsedByCurrentProcess;

	return r;
}